

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O2

bool __thiscall Assimp::MD5::MD5Parser::ParseSection(MD5Parser *this,Section *out)

{
  char **inout;
  byte bVar1;
  pointer pEVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  Element local_58;
  char local_48 [24];
  
  out->iLineNumber = this->lineNumber;
  inout = &this->buffer;
  pbVar4 = (byte *)this->buffer;
  while ((0x20 < (ulong)*pbVar4 || ((0x100003601U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))) {
    pbVar4 = pbVar4 + 1;
    *inout = (char *)pbVar4;
  }
  local_58.szStart = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
  std::__cxx11::string::operator=((string *)&out->mName,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  SkipSpaces<char>(inout);
  while( true ) {
    pbVar4 = (byte *)*inout;
    bVar1 = *pbVar4;
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
    goto LAB_0041ef10;
    if (bVar1 == 0x7b) break;
    do {
      do {
        pbVar5 = pbVar4 + 1;
        *inout = (char *)pbVar5;
        bVar1 = *pbVar4;
        pbVar4 = pbVar5;
      } while (0x20 < (ulong)bVar1);
    } while ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0);
    local_58.szStart = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
    std::__cxx11::string::operator=((string *)&out->mGlobalValue,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  *inout = (char *)(pbVar4 + 1);
LAB_0041eea4:
  do {
    bVar3 = SkipSpacesAndLineEnd(this);
    if (!bVar3) {
      return false;
    }
    if (**inout == '}') {
      *inout = *inout + 1;
LAB_0041ef10:
      bVar3 = SkipSpacesAndLineEnd(this);
      return bVar3;
    }
    local_58.szStart = (char *)0x0;
    local_58.iLineNumber = 0;
    local_58._12_4_ = 0;
    std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::
    emplace_back<Assimp::MD5::Element>(&out->mElements,&local_58);
    pEVar2 = (out->mElements).
             super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pEVar2[-1].iLineNumber = this->lineNumber;
    pbVar4 = (byte *)this->buffer;
    pEVar2[-1].szStart = (char *)pbVar4;
    while( true ) {
      pbVar5 = pbVar4 + 1;
      bVar1 = *pbVar4;
      if (bVar1 - 0xc < 2) break;
      if (bVar1 == 0) goto LAB_0041eea4;
      if (bVar1 == 10) break;
      *inout = (char *)pbVar5;
      pbVar4 = pbVar5;
    }
    this->lineNumber = this->lineNumber + 1;
    this->buffer = (char *)pbVar5;
    *pbVar4 = 0;
  } while( true );
}

Assistant:

bool MD5Parser::ParseSection(Section& out)
{
    // store the current line number for use in error messages
    out.iLineNumber = lineNumber;

    // first parse the name of the section
    char* sz = buffer;
    while (!IsSpaceOrNewLine( *buffer))buffer++;
    out.mName = std::string(sz,(uintptr_t)(buffer-sz));
    SkipSpaces();

    bool running = true;
    while (running) {
        if ('{' == *buffer) {
            // it is a normal section so read all lines
            buffer++;
            bool run = true;
            while (run)
            {
                if (!SkipSpacesAndLineEnd()) {
                    return false; // seems this was the last section
                }
                if ('}' == *buffer) {
                    buffer++;
                    break;
                }

                out.mElements.push_back(Element());
                Element& elem = out.mElements.back();

                elem.iLineNumber = lineNumber;
                elem.szStart = buffer;

                // terminate the line with zero
                while (!IsLineEnd( *buffer))buffer++;
                if (*buffer) {
                    ++lineNumber;
                    *buffer++ = '\0';
                }
            }
            break;
        }
        else if (!IsSpaceOrNewLine(*buffer))    {
            // it is an element at global scope. Parse its value and go on
            sz = buffer;
            while (!IsSpaceOrNewLine( *buffer++));
            out.mGlobalValue = std::string(sz,(uintptr_t)(buffer-sz));
            continue;
        }
        break;
    }
    return SkipSpacesAndLineEnd();
}